

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_template.c
# Opt level: O1

void curve_getrect(t_gobj *z,_glist *glist,t_word *data,t_template *template,t_float basex,
                  t_float basey,int *xp1,int *yp1,int *xp2,int *yp2)

{
  int iVar1;
  int iVar2;
  int iVar3;
  t_pd f;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  float fVar8;
  t_float tVar9;
  
  iVar2 = *(int *)&z[0xd].g_next;
  fVar8 = 0.0;
  if (*(char *)&z[0xb].g_pd == '\x01') {
    if (*(char *)((long)&z[0xb].g_pd + 1) == '\0') {
      fVar8 = *(float *)&z[0xb].g_next;
    }
    else {
      fVar8 = template_getfloat(template,(t_symbol *)z[0xb].g_next,data,0);
    }
  }
  if ((fVar8 != 0.0) || (NAN(fVar8))) {
    if ((*(ushort *)&glist->field_0xe8 & 0x20) != 0) {
      if (((ulong)z[3].g_pd & 8) != 0) goto LAB_00158d43;
      if ((*(ushort *)&glist->field_0xe8 & 0x20) != 0) goto LAB_00158c5d;
    }
    if (((ulong)z[3].g_pd & 4) == 0) {
LAB_00158c5d:
      if (iVar2 < 1) {
        iVar5 = -0x7fffffff;
        iVar7 = 0x7fffffff;
        iVar6 = 0x7fffffff;
        iVar4 = -0x7fffffff;
      }
      else {
        f = z[0xe].g_pd;
        iVar6 = 0x7fffffff;
        iVar4 = -0x7fffffff;
        iVar5 = -0x7fffffff;
        iVar7 = 0x7fffffff;
        do {
          tVar9 = fielddesc_getcoord((_fielddesc *)f,template,data,0);
          tVar9 = glist_xtopixels(glist,tVar9 + basex);
          iVar3 = (int)tVar9;
          tVar9 = fielddesc_getcoord((_fielddesc *)&f->c_nmethod,template,data,0);
          tVar9 = glist_ytopixels(glist,tVar9 + basey);
          iVar1 = (int)tVar9;
          if (iVar3 <= iVar7) {
            iVar7 = iVar3;
          }
          if (iVar5 <= iVar3) {
            iVar5 = iVar3;
          }
          if (iVar1 <= iVar6) {
            iVar6 = iVar1;
          }
          if (iVar4 <= iVar1) {
            iVar4 = iVar1;
          }
          f = (t_pd)&f->c_symbolmethod;
          iVar2 = iVar2 + -1;
        } while (iVar2 != 0);
      }
      *xp1 = iVar7;
      *yp1 = iVar6;
      *xp2 = iVar5;
      *yp2 = iVar4;
      return;
    }
  }
LAB_00158d43:
  *yp1 = 0x7fffffff;
  *xp1 = 0x7fffffff;
  *yp2 = -0x7fffffff;
  *xp2 = -0x7fffffff;
  return;
}

Assistant:

static void curve_getrect(t_gobj *z, t_glist *glist,
    t_word *data, t_template *template, t_float basex, t_float basey,
    int *xp1, int *yp1, int *xp2, int *yp2)
{
    t_curve *x = (t_curve *)z;
    int i, n = x->x_npoints;
    t_fielddesc *f = x->x_vec;
    int x1 = 0x7fffffff, x2 = -0x7fffffff, y1 = 0x7fffffff, y2 = -0x7fffffff;
    if (!fielddesc_getfloat(&x->x_vis, template, data, 0) ||
        (glist->gl_edit && x->x_flags & NOMOUSEEDIT) ||
        (!glist->gl_edit && x->x_flags & NOMOUSERUN))
    {
        *xp1 = *yp1 = 0x7fffffff;
        *xp2 = *yp2 = -0x7fffffff;
        return;
    }
    for (i = 0, f = x->x_vec; i < n; i++, f += 2)
    {
        int xloc = glist_xtopixels(glist,
            basex + fielddesc_getcoord(f, template, data, 0));
        int yloc = glist_ytopixels(glist,
            basey + fielddesc_getcoord(f+1, template, data, 0));
        if (xloc < x1) x1 = xloc;
        if (xloc > x2) x2 = xloc;
        if (yloc < y1) y1 = yloc;
        if (yloc > y2) y2 = yloc;
    }
    *xp1 = x1;
    *yp1 = y1;
    *xp2 = x2;
    *yp2 = y2;
}